

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::value::color4f>::TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::value::color4f> *this,color4f *fallback)

{
  float fVar1;
  color4f *fallback_local;
  TypedAttributeWithFallback<tinyusdz::value::color4f> *this_local;
  
  AttrMetas::AttrMetas(&this->_metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector(&this->_paths);
  nonstd::optional_lite::optional<tinyusdz::value::color4f>::optional(&this->_attrib);
  this->_empty = false;
  fVar1 = fallback->g;
  (this->_fallback).r = fallback->r;
  (this->_fallback).g = fVar1;
  fVar1 = fallback->a;
  (this->_fallback).b = fallback->b;
  (this->_fallback).a = fVar1;
  this->_blocked = false;
  return;
}

Assistant:

TypedAttributeWithFallback(const T &fallback) : _fallback(fallback) {}